

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

VertexIter __thiscall CMU462::HalfedgeMesh::collapseEdge(HalfedgeMesh *this,EdgeIter e)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pointer p_Var5;
  pointer p_Var6;
  value_type vVar7;
  _List_iterator<CMU462::Halfedge> *hj;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  pointer p_Var11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  _List_iterator<CMU462::Halfedge> *hj_1;
  pointer p_Var14;
  pointer p_Var15;
  pointer p_Var16;
  HalfedgeIter h_twin;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_to_be_deleted;
  HalfedgeIter hi;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_to_be_deleted;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_to_be_deleted;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_delete_vec;
  FaceIter f_n_p1;
  FaceIter f_0;
  EdgeIter e_n;
  EdgeIter e_0;
  HalfedgeIter h_n_twin;
  value_type h_n;
  HalfedgeIter h_0_twin;
  value_type h_0;
  value_type local_190;
  _List_node_base *local_188;
  _List_node_base *local_180;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_178;
  _List_node_base *local_158;
  const_iterator local_150;
  value_type local_148;
  value_type local_140;
  _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  local_138;
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_118;
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_f8;
  _List_node_base *local_d8;
  _List_node_base *local_d0;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  _List_node_base *local_b0;
  value_type local_a8;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  value_type local_88;
  value_type local_80;
  value_type local_78;
  value_type local_70;
  value_type local_68;
  _Rb_tree<std::_List_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::_Identity<std::_List_iterator<CMU462::Edge>_>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_60;
  
  local_68._M_node = e._M_node;
  remove_tetrahedron((set<std::_List_iterator<CMU462::Edge>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                      *)&local_60,this,e);
  std::
  _Rb_tree<std::_List_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::_Identity<std::_List_iterator<CMU462::Edge>_>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~_Rb_tree(&local_60);
  local_140._M_node = e._M_node[5]._M_prev;
  local_190._M_node = local_140._M_node[1]._M_next;
  p_Var2 = local_140._M_node[2]._M_next;
  local_150._M_node = local_190._M_node[2]._M_next;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&local_178,&local_140);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&local_178,&local_190);
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_node = local_190._M_node;
  while( true ) {
    p_Var13 = local_148._M_node[1]._M_next[1]._M_prev;
    if (p_Var13 == local_190._M_node) break;
    local_148._M_node = p_Var13;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_f8,&local_148);
  }
  local_b0 = (local_f8._M_impl.super__Vector_impl_data._M_start)->_M_node;
  p_Var13 = local_b0[1]._M_next;
  p_Var10 = local_f8._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  local_180 = p_Var10[1]._M_next;
  local_c0 = p_Var13[1]._M_prev;
  vVar7._M_node = local_140._M_node;
  do {
    p_Var12 = vVar7._M_node;
    vVar7._M_node = p_Var12[1]._M_prev;
  } while (p_Var12[1]._M_prev != local_140._M_node);
  local_188 = local_190._M_node[1]._M_prev;
  p_Var3 = local_c0;
  do {
    p_Var8 = p_Var3;
    p_Var3 = p_Var8[1]._M_prev;
  } while (p_Var3 != p_Var13);
  local_d0 = p_Var10[1]._M_prev;
  p_Var3 = local_d0;
  do {
    p_Var9 = p_Var3;
    p_Var3 = p_Var9[1]._M_prev;
  } while (p_Var3 != p_Var10);
  p_Var3 = p_Var2[2]._M_next;
  p_Var1 = local_150._M_node[2]._M_next;
  p_Var4 = local_150._M_node[1]._M_prev;
  p_Var2[1]._M_next =
       (_List_node_base *)(((double)local_150._M_node[1]._M_next + (double)p_Var2[1]._M_next) * 0.5)
  ;
  p_Var2[1]._M_prev = (_List_node_base *)(((double)p_Var4 + (double)p_Var2[1]._M_prev) * 0.5);
  p_Var2[2]._M_next = (_List_node_base *)(((double)p_Var3 + (double)p_Var1) * 0.5);
  local_c8 = p_Var13[2]._M_next;
  local_d8 = local_180[2]._M_next;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_node = local_180;
  local_80._M_node = p_Var10;
  local_78._M_node = p_Var13;
  local_70._M_node = local_b0;
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             *)&local_118,&local_68);
  local_90._M_node = local_b0[2]._M_prev;
  local_98._M_node = p_Var10[2]._M_prev;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0._M_node = local_140._M_node[3]._M_next;
  p_Var13 = p_Var13[3]._M_next;
  local_158 = p_Var10[3]._M_next;
  local_b8 = local_190._M_node[3]._M_next;
  local_a8._M_node = local_b8;
  if (local_b0[1]._M_prev == p_Var12) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_178,&local_70);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_178,&local_78);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               *)&local_118,&local_90);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)&local_138,&local_a0);
    p_Var10 = local_c0;
    if (p_Var13 == local_158 && local_188[1]._M_prev == local_180) {
      p_Var10 = local_188;
    }
    p_Var12[1]._M_prev = p_Var10;
    p_Var12[3]._M_next = p_Var13;
    p_Var8[1]._M_prev = p_Var12;
    local_c8[0xc]._M_prev = p_Var12;
  }
  else {
    p_Var12[1]._M_prev = local_b0;
    p_Var12 = local_b0;
    p_Var13 = local_a0._M_node;
  }
  p_Var13[9]._M_next = p_Var12;
  for (p_Var11 = local_f8._M_impl.super__Vector_impl_data._M_start;
      p_Var11 != local_f8._M_impl.super__Vector_impl_data._M_finish; p_Var11 = p_Var11 + 1) {
    p_Var11->_M_node[2]._M_next = p_Var2;
  }
  if (local_188[1]._M_prev == local_180) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_178,&local_80);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&local_178,&local_88);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               *)&local_118,&local_98);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)&local_138,&local_a8);
    local_188[1]._M_prev = local_d0;
    local_188[3]._M_next = local_158;
    p_Var9[1]._M_prev = local_188;
    local_d8[0xc]._M_prev = local_d0;
    p_Var13 = local_158;
  }
  else {
    local_180[1]._M_prev = local_188;
    p_Var13 = local_b8;
  }
  p_Var11 = local_178._M_impl.super__Vector_impl_data._M_finish;
  p_Var13[9]._M_next = local_188;
  p_Var2[0xc]._M_prev = local_188;
  for (p_Var14 = local_178._M_impl.super__Vector_impl_data._M_start; p_Var14 != p_Var11;
      p_Var14 = p_Var14 + 1) {
    std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::erase
              (&this->halfedges,p_Var14->_M_node);
  }
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::erase
            (&this->vertices,local_150);
  p_Var6 = local_118._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var15 = local_118._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = local_138._M_impl.super__Vector_impl_data._M_finish, p_Var15 != p_Var6;
      p_Var15 = p_Var15 + 1) {
    std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::erase
              (&this->edges,p_Var15->_M_node);
  }
  for (p_Var16 = local_138._M_impl.super__Vector_impl_data._M_start; p_Var16 != p_Var5;
      p_Var16 = p_Var16 + 1) {
    std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::erase
              (&this->faces,p_Var16->_M_node);
  }
  std::
  _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ::~_Vector_base(&local_138);
  std::
  _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~_Vector_base(&local_118);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_f8);
  std::
  _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~_Vector_base(&local_178);
  return (VertexIter)p_Var2;
}

Assistant:

VertexIter HalfedgeMesh::collapseEdge(EdgeIter e) {
  // This method should collapse the given edge and return an iterator to
  // the new vertex created by the collapse.

  remove_tetrahedron(e);

  auto h = e->halfedge(), h_twin = h->twin();
  auto v_keep = h->vertex(), v_delete = h_twin->vertex();

  // Collect
  // HalfEdges
  vector<HalfedgeIter> h_to_be_deleted;
  h_to_be_deleted.push_back(h);
  h_to_be_deleted.push_back(h_twin);

  vector<HalfedgeIter> h_delete_vec;
  auto hi = h_twin;
  while (hi->twin()->next() != h_twin) {
    hi = hi->twin()->next();
    h_delete_vec.push_back(hi);
  }
  auto h_0 = h_delete_vec.front(), h_0_twin = h_0->twin(),
       h_n = h_delete_vec.back(), h_n_twin = h_n->twin(),
       h_1 = h_0_twin->next();

  auto h_first = h;
  while (h_first->next() != h) {
    h_first = h_first->next();
  }
  auto h_last = h_twin->next();
  auto h_first_prev = h_1;
  while (h_first_prev->next() != h_0_twin) {
    h_first_prev = h_first_prev->next();
  }
  auto h_last_prev = h_n->next();
  while (h_last_prev->next() != h_n) {
    h_last_prev = h_last_prev->next();
  }
  auto h_last_next = h_n->next();

  // Vertices
  v_keep->position = (v_keep->position + v_delete->position) / 2;
  auto v_0 = h_0_twin->vertex(), v_n = h_n_twin->vertex();

  // Edges
  vector<EdgeIter> e_to_be_deleted;
  e_to_be_deleted.push_back(e);
  auto e_0 = h_0->edge(), e_n = h_n->edge();

  // Faces
  vector<FaceIter> f_to_be_deleted;
  auto f_0 = h->face(),
       f_1 = h_0_twin->face(),
       f_n = h_n->face(),
       f_n_p1 = h_twin->face();

  // Reassign
  if (h_0->next() == h_first) {
    h_to_be_deleted.push_back(h_0);
    h_to_be_deleted.push_back(h_0_twin);
    e_to_be_deleted.push_back(e_0);
    f_to_be_deleted.push_back(f_0);

    // HalfEdges
    // We have a corner case here: when the faces on either side of the edge have a degree of 3,
    // while the vertex to be deleted also has a degree of 3. We have to deal with this carefully.
    if (h_last->next() == h_n_twin && f_1 == f_n) {
      h_first->next() = h_last;
    } else {
      h_first->next() = h_1;
    }
    h_first->face() = f_1;
    h_first_prev->next() = h_first;

    // Vertices
    v_0->halfedge() = h_first;

    // Faces
    f_1->halfedge() = h_first;
  } else {
    h_first->next() = h_0;
    f_0->halfedge() = h_0;
  }
  for (auto& hj : h_delete_vec) {
    hj->vertex() = v_keep;
  }
  if (h_last->next() == h_n_twin) {
    h_to_be_deleted.push_back(h_n);
    h_to_be_deleted.push_back(h_n_twin);
    e_to_be_deleted.push_back(e_n);
    f_to_be_deleted.push_back(f_n_p1);

    // HalfEdges
    h_last->next() = h_last_next;
    h_last->face() = f_n;
    h_last_prev->next() = h_last;

    // Vertices
    v_n->halfedge() = h_last_next;

    // Faces
    f_n->halfedge() = h_last;
  } else {
    h_n_twin->next() = h_last;
    f_n_p1->halfedge() = h_last;
  }
  v_keep->halfedge() = h_last;

  // Delete
  for (auto& hj : h_to_be_deleted) {
    deleteHalfedge(hj);
  }
  deleteVertex(v_delete);
  for (auto& ej : e_to_be_deleted) {
    deleteEdge(ej);
  }
  for (auto& fj : f_to_be_deleted) {
    deleteFace(fj);
  }

  return v_keep;
}